

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O2

void sGenXtrue(int n,int nrhs,float *x,int ldx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar1;
  }
  uVar2 = (ulong)(uint)nrhs;
  if (nrhs < 1) {
    uVar2 = uVar1;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      x[uVar4] = 1.0;
    }
    x = x + ldx;
  }
  return;
}

Assistant:

void
sGenXtrue(int n, int nrhs, float *x, int ldx)
{
    int  i, j;
    for (j = 0; j < nrhs; ++j)
	for (i = 0; i < n; ++i) {
	    x[i + j*ldx] = 1.0;/* + (float)(i+1.)/n;*/
	}
}